

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

void SHMCleanup(void)

{
  uint uVar1;
  FILE *pFVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  uint *puVar7;
  int *piVar8;
  char *pcVar9;
  DWORD local_14;
  void *pvStack_10;
  pid_t my_pid;
  SHM_FIRST_HEADER *header;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  SHMLock();
  SHMRelease();
  local_14 = gPID;
  pvStack_10 = Volatile<void_*>::Load(shm_segment_bases);
  bVar3 = Volatile<int>::operator!=((Volatile<int> *)((long)pvStack_10 + 0x40),(int *)&local_14);
  if (!bVar3) {
    fprintf(_stderr,"] %s %s:%d","SHMCleanup",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x206);
    pFVar2 = _stderr;
    pvVar5 = Volatile<void_*>::Load(&locking_thread);
    lVar6 = syscall(0xba);
    fprintf(pFVar2,
            "Expression: header->spinlock != my_pid, Description: SHMCleanup called while the current process still owns the lock [owner thread=%u, current thread: %u]\n"
            ,pvVar5,lVar6);
  }
  while (shm_numsegments != 0) {
    shm_numsegments = shm_numsegments + -1;
    pvVar5 = Volatile::operator_cast_to_void_((Volatile *)(shm_segment_bases + shm_numsegments));
    iVar4 = munmap(pvVar5,0x40000);
    if (iVar4 == -1) {
      fprintf(_stderr,"] %s %s:%d","SHMCleanup",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x210);
      pFVar2 = _stderr;
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      fprintf(pFVar2,"munmap() failed; errno is %d (%s).\n",(ulong)uVar1,pcVar9);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return;
  }
  abort();
}

Assistant:

void SHMCleanup(void)
{
    SHM_FIRST_HEADER *header;
    pid_t my_pid;

    TRACE("Starting shared memory cleanup\n");

    SHMLock();
    SHMRelease();

    /* We should not be holding the spinlock at this point. If we are, release
       the spinlock. by setting it to 0 */
    my_pid = gPID;
    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    _ASSERT_MSG(header->spinlock != my_pid,
            "SHMCleanup called while the current process still owns the lock "
            "[owner thread=%u, current thread: %u]\n",
            locking_thread.Load(), THREADSilentGetCurrentThreadId());

    /* Unmap memory segments */
    while(shm_numsegments)
    {
        shm_numsegments--;
        if ( -1 == munmap( shm_segment_bases[ shm_numsegments ],
                           segment_size ) )
        {
            ASSERT( "munmap() failed; errno is %d (%s).\n",
                  errno, strerror( errno ) );
        }
    }

    save_waste();
    TRACE("SHMCleanup complete!\n");
}